

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

TiXmlElement * __thiscall despot::Parser::GetParameterElement(Parser *this,TiXmlElement *element)

{
  bool condition;
  TiXmlElement *this_00;
  char *pcVar1;
  string param_type;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = util::tinyxml::TiXmlNode::FirstChildElement(&element->super_TiXmlNode,"Parameter");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  pcVar1 = util::tinyxml::TiXmlElement::Attribute(this_00,"type");
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_58);
  }
  else {
    util::tinyxml::TiXmlElement::Attribute(this_00,"type");
    std::__cxx11::string::assign((char *)&local_58);
  }
  condition = std::operator==(&local_58,"TBL");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Only parameter type \"TBL\" is supported.\n",&local_59);
  Ensure(this,condition,&local_38,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return this_00;
}

Assistant:

TiXmlElement* Parser::GetParameterElement(TiXmlElement* element) {
	TiXmlElement* e_Parameter = element->FirstChildElement("Parameter");

	string param_type = "";
	if (e_Parameter->Attribute("type") == NULL)
		param_type = "TBL"; //the default case
	else
		param_type = e_Parameter->Attribute("type");

	Ensure(param_type == "TBL", "Only parameter type \"TBL\" is supported.\n");

	return e_Parameter;
}